

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::inc_mhl(CPU *this)

{
  ushort uVar1;
  Registers *pRVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  
  uVar1._0_1_ = this->regs->h;
  uVar1._1_1_ = this->regs->l;
  uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  iVar4 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)uVar6);
  pRVar2 = this->regs;
  bVar5 = pRVar2->f & 0x10;
  bVar3 = bVar5 + 0x20;
  if ((~(byte)iVar4 & 0xf) != 0) {
    bVar3 = bVar5;
  }
  pRVar2->f = bVar3;
  bVar3 = (byte)iVar4 + 1;
  if (bVar3 == 0) {
    pRVar2->f = pRVar2->f | 0x80;
  }
  (*this->mmu->_vptr_IMmu[2])(this->mmu,(ulong)uVar6,(ulong)bVar3);
  return 3;
}

Assistant:

int CPU::inc_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    uint8_t val = mmu.read_byte(addr);

    // CHECK
    inc_r8(val);

    mmu.write_byte(addr, val);
    return 3;
}